

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::getSplat(APInt *this,uint NewLen,APInt *V)

{
  undefined8 extraout_RDX;
  uint uVar2;
  APInt AVar3;
  APInt local_30;
  undefined8 uVar1;
  
  if (V->BitWidth <= NewLen) {
    AVar3 = zextOrSelf(this,(uint)V);
    uVar1 = AVar3._8_8_;
    for (uVar2 = V->BitWidth; uVar2 < NewLen; uVar2 = uVar2 * 2) {
      shl(&local_30,(uint)this);
      operator|=(this,&local_30);
      ~APInt(&local_30);
      uVar1 = extraout_RDX;
    }
    AVar3._8_8_ = uVar1;
    AVar3.U.pVal = (uint64_t *)this;
    return AVar3;
  }
  __assert_fail("NewLen >= V.getBitWidth() && \"Can\'t splat to smaller bit width!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x20a,"static APInt llvm::APInt::getSplat(unsigned int, const APInt &)");
}

Assistant:

APInt APInt::getSplat(unsigned NewLen, const APInt &V) {
  assert(NewLen >= V.getBitWidth() && "Can't splat to smaller bit width!");

  APInt Val = V.zextOrSelf(NewLen);
  for (unsigned I = V.getBitWidth(); I < NewLen; I <<= 1)
    Val |= Val << I;

  return Val;
}